

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

string * __thiscall
duckdb::Time::ToString_abi_cxx11_(string *__return_storage_ptr__,Time *this,dtime_t time)

{
  idx_t length;
  tuple<char_*,_std::default_delete<char[]>_> data;
  unique_ptr<char[],_std::default_delete<char>,_false> buffer;
  int32_t time_units [4];
  char micro_buffer [6];
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_50;
  int32_t local_48;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c [3];
  char local_2e [6];
  
  Convert((dtime_t)this,&local_48,&local_44,&local_40,local_3c);
  length = TimeToStringCast::MicrosLength(local_3c[0],local_2e);
  data.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)operator_new__(length);
  local_50._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (tuple<char_*,_std::default_delete<char[]>_>)
       data.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  TimeToStringCast::Format
            ((char *)data.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl,length,&local_48,local_2e);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             data.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl,
             (char *)(length + (long)data.
                                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                     super__Head_base<0UL,_char_*,_false>._M_head_impl));
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string Time::ToString(dtime_t time) {
	int32_t time_units[4];
	Time::Convert(time, time_units[0], time_units[1], time_units[2], time_units[3]);

	char micro_buffer[6];
	auto length = TimeToStringCast::Length(time_units, micro_buffer);
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(length);
	TimeToStringCast::Format(buffer.get(), length, time_units, micro_buffer);
	return string(buffer.get(), length);
}